

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QVariant * __thiscall
QMap<QString,_QVariant>::value(QMap<QString,_QVariant> *this,QString *key,QVariant *defaultValue)

{
  bool bVar1;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
  *in_stack_ffffffffffffffa8;
  QVariant *this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                      *)0x3ce9a6);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)0x3ce9d4);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x3ce9e5);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)0x3ce9f4);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
         ::cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_QString,_QVariant>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_QString,_QVariant>_> *)this_00);
      ::QVariant::QVariant(this_00,(QVariant *)in_stack_ffffffffffffffa8);
    }
    else {
      ::QVariant::QVariant(this_00,(QVariant *)in_stack_ffffffffffffffa8);
    }
  }
  else {
    ::QVariant::QVariant(this_00,(QVariant *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }